

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O0

void __thiscall cppurses::Text_display::clear(Text_display *this)

{
  Text_display *this_local;
  
  std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::clear
            (&(this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>);
  Cursor_data::set_x(&(this->super_Widget).cursor,0);
  Cursor_data::set_y(&(this->super_Widget).cursor,0);
  (*(this->super_Widget)._vptr_Widget[3])();
  sig::
  Signal<void(cppurses::Glyph_string_const&),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(cppurses::Glyph_string_const&)>,std::mutex>
  ::operator()((Signal<void(cppurses::Glyph_string_const&),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(cppurses::Glyph_string_const&)>,std::mutex>
                *)&this->contents_modified,&this->contents_);
  return;
}

Assistant:

void Text_display::clear() {
    contents_.clear();
    this->cursor.set_x(0);
    this->cursor.set_y(0);
    this->update();
    contents_modified(contents_);
}